

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEES_PDU.cpp
# Opt level: O1

KBOOL __thiscall KDIS::PDU::SEES_PDU::operator==(SEES_PDU *this,SEES_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                          (&this->m_OriginatingEntity,&Value->m_OriginatingEntity), !KVar1)) &&
      (this->m_ui16IrSigRepIndex == Value->m_ui16IrSigRepIndex)) &&
     (((this->m_ui16CrossSection == Value->m_ui16CrossSection &&
       (this->m_ui16NumPropulsionSys == Value->m_ui16NumPropulsionSys)) &&
      ((this->m_ui16NumVectoringNozzleSys == Value->m_ui16NumVectoringNozzleSys &&
       (bVar2 = std::operator!=(&this->m_vPropSys,&Value->m_vPropSys), !bVar2)))))) {
    bVar2 = std::operator!=(&this->m_vVecNozzleSys,&Value->m_vVecNozzleSys);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL SEES_PDU::operator == ( const SEES_PDU & Value ) const
{
    if( Header::operator            !=( Value ) )                          return false;
    if( m_OriginatingEntity         != Value.m_OriginatingEntity )         return false;
    if( m_ui16IrSigRepIndex         != Value.m_ui16IrSigRepIndex )         return false;
    if( m_ui16CrossSection          != Value.m_ui16CrossSection )          return false;
    if( m_ui16NumPropulsionSys      != Value.m_ui16NumPropulsionSys )      return false;
    if( m_ui16NumVectoringNozzleSys != Value.m_ui16NumVectoringNozzleSys ) return false;
    if( m_vPropSys                  != Value.m_vPropSys )                  return false;
    if( m_vVecNozzleSys             != Value.m_vVecNozzleSys )             return false;
    return true;
}